

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsCLI11.hpp
# Opt level: O2

void __thiscall helics::helicsCLI11App::add_config_validation(helicsCLI11App *this)

{
  Option *this_00;
  allocator<char> local_9a;
  allocator<char> local_99;
  _Any_data local_98;
  code *local_88;
  code *local_80;
  string local_70;
  string local_50;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"--config",&local_9a);
  this_00 = CLI::App::get_option(&this->super_App,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  if (this_00 != (Option *)0x0) {
    (this->super_App).validate_positionals_ = true;
    local_98._M_unused._M_object = (void *)0x0;
    local_98._8_8_ = 0;
    local_80 = CLI::std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/../core/helicsCLI11.hpp:163:24)>
               ::_M_invoke;
    local_88 = CLI::std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/../core/helicsCLI11.hpp:163:24)>
               ::_M_manager;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"",&local_9a);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"",&local_99);
    CLI::Option::check(this_00,(function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                *)&local_98,&local_50,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    CLI::std::_Function_base::~_Function_base((_Function_base *)&local_98);
  }
  return;
}

Assistant:

void add_config_validation()
    {
        auto* opt = get_option("--config");
        if (opt != nullptr) {
            validate_positionals();
            opt->check([](const std::string& fname) {
                static const std::set<std::string> validExt = {
                    ".ini", ".toml", ".json", ".INI", ".JSON", ".TOML"};
                auto ext = std::filesystem::path(fname).extension().string();
                if (validExt.find(ext) == validExt.end()) {
                    return fname + " does not have a valid extension";
                }
                return std::string{};
            });
        }
    }